

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O0

object_task<crnlib::qdxt1> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::qdxt1>,crnlib::qdxt1*,void(crnlib::qdxt1::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (crnlib *this,qdxt1 **init0,offset_in_qdxt1_to_subr *init1,object_task_flags *init2)

{
  object_task<crnlib::qdxt1> *this_00;
  object_task<crnlib::qdxt1> *p;
  object_task_flags *init2_local;
  offset_in_qdxt1_to_subr *init1_local;
  qdxt1 **init0_local;
  
  this_00 = (object_task<crnlib::qdxt1> *)crnlib_malloc(0x28);
  object_task<crnlib::qdxt1>::object_task
            (this_00,*(qdxt1 **)this,(object_method_ptr)*init0,(uint)init0[1]);
  return this_00;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2)
    {
        T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
        return new (static_cast<void*>(p)) T(init0, init1, init2);
    }